

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STAmount.cpp
# Opt level: O3

string * __thiscall
jbcoin::STAmount::getFullText_abi_cxx11_(string *__return_storage_ptr__,STAmount *this)

{
  size_type *psVar1;
  ulong uVar2;
  long *plVar3;
  undefined8 *puVar4;
  long lVar5;
  ulong *puVar6;
  ulong uVar7;
  undefined8 uVar8;
  undefined1 btc;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *in_R9;
  AccountID *pAVar9;
  string local_b0;
  ulong *local_90;
  Currency *local_88;
  ulong local_80;
  long lStack_78;
  string local_70;
  long *local_50 [2];
  long local_40 [2];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  (*(this->super_STBase)._vptr_STBase[6])(local_50,this);
  plVar3 = (long *)std::__cxx11::string::append((char *)local_50);
  puVar6 = (ulong *)(plVar3 + 2);
  if ((ulong *)*plVar3 == puVar6) {
    local_80 = *puVar6;
    lStack_78 = plVar3[3];
    local_90 = &local_80;
  }
  else {
    local_80 = *puVar6;
    local_90 = (ulong *)*plVar3;
  }
  local_88 = (Currency *)plVar3[1];
  *plVar3 = (long)puVar6;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  to_string_abi_cxx11_(&local_70,(jbcoin *)&this->mIssue,local_88);
  uVar2 = (long)local_88->pn + local_70._M_string_length;
  uVar7 = 0xf;
  if (local_90 != &local_80) {
    uVar7 = local_80;
  }
  if (uVar7 < uVar2) {
    in_R9 = &local_70.field_2;
    uVar8 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != in_R9) {
      uVar8 = local_70.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar8 < uVar2) goto LAB_001af6f9;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,(ulong)local_90);
    btc = SUB81(in_R9,0);
  }
  else {
LAB_001af6f9:
    btc = SUB81(in_R9,0);
    puVar4 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_90,(ulong)local_70._M_dataplus._M_p);
  }
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  psVar1 = puVar4 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar4 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar1) {
    local_b0.field_2._M_allocated_capacity = *psVar1;
    local_b0.field_2._8_8_ = puVar4[3];
  }
  else {
    local_b0.field_2._M_allocated_capacity = *psVar1;
    local_b0._M_dataplus._M_p = (pointer)*puVar4;
  }
  local_b0._M_string_length = puVar4[1];
  *puVar4 = psVar1;
  puVar4[1] = 0;
  *(undefined1 *)psVar1 = 0;
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if (local_90 != &local_80) {
    operator_delete(local_90,local_80 + 1);
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  if (this->mIsNative != false) {
    return __return_storage_ptr__;
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  if ((this->mIssue).currency.pn[0] == 0) {
    uVar2 = 0;
    do {
      uVar7 = uVar2;
      if (uVar7 == 4) goto LAB_001af84a;
      uVar2 = uVar7 + 1;
    } while ((this->mIssue).currency.pn[uVar7 + 1] == 0);
    if (3 < uVar7) goto LAB_001af84a;
  }
  pAVar9 = &(this->mIssue).account;
  noAccount();
  lVar5 = 0;
  do {
    if (*(char *)((long)pAVar9->pn + lVar5) != *(char *)((long)noAccount::account.pn + lVar5)) {
      if (lVar5 != 0x14) {
        encodeToken_abi_cxx11_(&local_b0,(jbcoin *)0x0,(uint8_t)pAVar9,(void *)0x14,0,(bool)btc);
        std::__cxx11::string::_M_append
                  ((char *)__return_storage_ptr__,(ulong)local_b0._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p == &local_b0.field_2) {
          return __return_storage_ptr__;
        }
        operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
        return __return_storage_ptr__;
      }
      break;
    }
    lVar5 = lVar5 + 1;
  } while (lVar5 != 0x14);
LAB_001af84a:
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string
STAmount::getFullText () const
{
    std::string ret;

    ret.reserve(64);
    ret = getText () + "/" + to_string (mIssue.currency);

    if (!mIsNative)
    {
        ret += "/";

        if (isXRP (*this))
            ret += "0";
        else if (mIssue.account == noAccount())
            ret += "1";
        else
            ret += to_string (mIssue.account);
    }

    return ret;
}